

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

uint32_t __thiscall
basisu::bitwise_coder::put_bits(bitwise_coder *this,uint32_t bits,uint32_t num_bits)

{
  bitwise_coder *this_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t v;
  uint32_t local_4;
  
  if (0x20 < in_EDX) {
    __assert_fail("num_bits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x933,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
  }
  if ((ulong)in_ESI < (ulong)(1L << ((byte)in_EDX & 0x3f))) {
    if (in_EDX == 0) {
      local_4 = 0;
    }
    else {
      *(ulong *)(in_RDI + 0x18) = (ulong)in_EDX + *(long *)(in_RDI + 0x18);
      this_00 = (bitwise_coder *)
                ((ulong)in_ESI << ((byte)*(undefined4 *)(in_RDI + 0x14) & 0x3f) |
                (ulong)*(uint *)(in_RDI + 0x10));
      *(uint *)(in_RDI + 0x14) = in_EDX + *(int *)(in_RDI + 0x14);
      while (7 < *(uint *)(in_RDI + 0x14)) {
        append_byte(this_00,(uint8_t)((ulong)in_RDI >> 0x38));
        this_00 = (bitwise_coder *)((ulong)this_00 >> 8);
        *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + -8;
      }
      *(uint *)(in_RDI + 0x10) = (uint)this_00 & 0xff;
      local_4 = in_EDX;
    }
    return local_4;
  }
  __assert_fail("bits < (1ULL << num_bits)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0x934,"uint32_t basisu::bitwise_coder::put_bits(uint32_t, uint32_t)");
}

Assistant:

inline uint32_t put_bits(uint32_t bits, uint32_t num_bits)
		{
			assert(num_bits <= 32);
			assert(bits < (1ULL << num_bits));

			if (!num_bits)
				return 0;

			m_total_bits += num_bits;

			uint64_t v = (static_cast<uint64_t>(bits) << m_bit_buffer_size) | m_bit_buffer;
			m_bit_buffer_size += num_bits;

			while (m_bit_buffer_size >= 8)
			{
				append_byte(static_cast<uint8_t>(v));
				v >>= 8;
				m_bit_buffer_size -= 8;
			}

			m_bit_buffer = static_cast<uint8_t>(v);
			return num_bits;
		}